

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::GPUShaderFP64Test2::iterate(GPUShaderFP64Test2 *this)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *description;
  bool bVar2;
  qpTestResult testResult;
  TestContext *this_01;
  pointer uniform_type;
  shaderStage *psVar3;
  string local_48;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"GL_ARB_gpu_shader_fp64 is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_48);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  testInit(this);
  prepareShaderStages(this);
  prepareUniformTypes(this);
  psVar3 = (this->m_shader_stages).
           super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_shader_stages).
      super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    bVar1 = true;
    bVar2 = true;
    do {
      uniform_type = (this->m_uniform_types).
                     super__Vector_base<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_uniform_types).
          super__Vector_base<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
          ._M_impl.super__Vector_impl_data._M_finish != uniform_type) {
        do {
          bVar2 = bVar1;
          bVar1 = test(this,*psVar3,uniform_type);
          if (!bVar1) {
            bVar2 = false;
          }
          uniform_type = uniform_type + 1;
          bVar1 = bVar2;
        } while (uniform_type !=
                 (this->m_uniform_types).
                 super__Vector_base<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      psVar3 = psVar3 + 1;
    } while ((this->m_shader_stages).
             super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
             ._M_impl.super__Vector_impl_data._M_finish != psVar3);
    if (!bVar2) {
      this_01 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_009370f6;
    }
  }
  this_01 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_009370f6:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test2::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	/* Initialize test */
	testInit();

	prepareShaderStages();
	prepareUniformTypes();

	/* For all shaders and uniform type combinations */
	for (std::vector<shaderStage>::const_iterator shader_stage = m_shader_stages.begin();
		 m_shader_stages.end() != shader_stage; ++shader_stage)
	{
		for (std::vector<uniformTypeDetails>::const_iterator uniform_type = m_uniform_types.begin();
			 m_uniform_types.end() != uniform_type; ++uniform_type)
		{
			/* Execute test */
			if (false == test(*shader_stage, *uniform_type))
			{
				result = false;
			}
		}
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}